

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_4c.h
# Opt level: O0

double __thiscall SAUF4C<UF>::Alloc(SAUF4C<UF> *this)

{
  Mat1b *pMVar1;
  PerformanceEvaluator *perf;
  double dVar2;
  double dVar3;
  double ma_t;
  double t;
  Size local_80;
  Mat_<int> local_78;
  double local_18;
  double ls_t;
  SAUF4C<UF> *this_local;
  
  pMVar1 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_;
  perf = &(this->super_Labeling2D<(Connectivity2D)4,_false>).super_Labeling.perf_;
  ls_t = (double)this;
  local_18 = UF::Alloc((int)((long)*(int *)&pMVar1->field_0x8 * (long)*(int *)&pMVar1->field_0xc +
                             1U >> 1) + 1,perf);
  PerformanceEvaluator::start(perf);
  cv::MatSize::operator()((MatSize *)&local_80);
  cv::Mat_<int>::Mat_(&local_78,&local_80);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_,&local_78)
  ;
  cv::Mat_<int>::~Mat_(&local_78);
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_)->field_0x18);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)4,_false>).super_Labeling.perf_);
  dVar2 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)4,_false>).super_Labeling.perf_);
  PerformanceEvaluator::start
            (&(this->super_Labeling2D<(Connectivity2D)4,_false>).super_Labeling.perf_);
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_)->field_0x18);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)4,_false>).super_Labeling.perf_);
  dVar3 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)4,_false>).super_Labeling.perf_);
  return local_18 + (dVar2 - dVar3);
}

Assistant:

double Alloc()
    {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_4_CONNECTIVITY, perf_);
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double ma_t = t - perf_.last();
        // Return total time
        return ls_t + ma_t;
    }